

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLookupResultValid
               (Texture1DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FilterMode FVar4;
  ConstPixelBufferAccess *pCVar5;
  ConstPixelBufferAccess *level1;
  float fVar6;
  int local_90;
  int level_1;
  int maxLevel_1;
  int minLevel_1;
  float local_7c;
  float local_78;
  float maxF;
  float minF;
  int level;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  int layer;
  bool canBeMinified;
  float fStack_50;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  float coordX;
  IVec2 layerRange;
  Vec4 *result_local;
  Vec2 *lodBounds_local;
  Vec2 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  Texture1DArrayView *texture_local;
  
  layerRange.m_data = (int  [2])result;
  iVar2 = Texture1DArrayView::getNumLayers(texture);
  iVar3 = Vector<int,_3>::y(&prec->coordBits);
  fVar6 = Vector<float,_2>::y(coord);
  computeLayerRange((tcu *)&minLod,iVar2,iVar3,fVar6);
  maxLod = Vector<float,_2>::x(coord);
  fStack_50 = Vector<float,_2>::x(lodBounds);
  layer = (int)Vector<float,_2>::y(lodBounds);
  isNearestMipmap = fStack_50 <= sampler->lodThreshold;
  isLinearMipmap = sampler->lodThreshold <= (float)layer && (float)layer != sampler->lodThreshold;
  minTexLevel = Vector<int,_2>::x((Vector<int,_2> *)&minLod);
  do {
    iVar2 = minTexLevel;
    iVar3 = Vector<int,_2>::y((Vector<int,_2> *)&minLod);
    if (iVar3 < iVar2) {
      return false;
    }
    if ((isNearestMipmap & 1U) != 0) {
      pCVar5 = Texture1DArrayView::getLevel(texture,0);
      bVar1 = isLevelSampleResultValid
                        (pCVar5,sampler,sampler->magFilter,prec,maxLod,minTexLevel,
                         (Vec4 *)layerRange.m_data);
      if (bVar1) {
        return true;
      }
    }
    if ((isLinearMipmap & 1U) != 0) {
      maxTexLevel._3_1_ = TexVerifierUtil::isNearestMipmapFilter(sampler->minFilter);
      maxTexLevel._2_1_ = TexVerifierUtil::isLinearMipmapFilter(sampler->minFilter);
      minLevel = 0;
      iVar2 = Texture1DArrayView::getNumLevels(texture);
      maxLevel = iVar2 + -1;
      if (((maxTexLevel._2_1_ & 1) == 0) || (maxLevel < 1)) {
        if ((maxTexLevel._3_1_ & 1) == 0) {
          pCVar5 = Texture1DArrayView::getLevel(texture,0);
          bVar1 = isLevelSampleResultValid
                            (pCVar5,sampler,sampler->minFilter,prec,maxLod,minTexLevel,
                             (Vec4 *)layerRange.m_data);
          if (bVar1) {
            return true;
          }
        }
        else {
          fVar6 = ::deFloatCeil(fStack_50 + 0.5);
          local_90 = de::clamp<int>((int)fVar6 + -1,0,maxLevel);
          fVar6 = ::deFloatFloor((float)layer + 0.5);
          iVar2 = de::clamp<int>((int)fVar6,0,maxLevel);
          for (; local_90 <= iVar2; local_90 = local_90 + 1) {
            pCVar5 = Texture1DArrayView::getLevel(texture,local_90);
            FVar4 = TexVerifierUtil::getLevelFilter(sampler->minFilter);
            bVar1 = isLevelSampleResultValid
                              (pCVar5,sampler,FVar4,prec,maxLod,minTexLevel,
                               (Vec4 *)layerRange.m_data);
            if (bVar1) {
              return true;
            }
          }
        }
      }
      else {
        fVar6 = ::deFloatFloor(fStack_50);
        level = de::clamp<int>((int)fVar6,0,maxLevel + -1);
        fVar6 = ::deFloatFloor((float)layer);
        minF = (float)de::clamp<int>((int)fVar6,0,maxLevel + -1);
        for (maxF = (float)level; (int)maxF <= (int)minF; maxF = (float)((int)maxF + 1)) {
          local_78 = de::clamp<float>(fStack_50 - (float)(int)maxF,0.0,1.0);
          local_7c = de::clamp<float>((float)layer - (float)(int)maxF,0.0,1.0);
          pCVar5 = Texture1DArrayView::getLevel(texture,(int)maxF);
          level1 = Texture1DArrayView::getLevel(texture,(int)maxF + 1);
          FVar4 = TexVerifierUtil::getLevelFilter(sampler->minFilter);
          fVar6 = maxLod;
          iVar2 = minTexLevel;
          Vector<float,_2>::Vector((Vector<float,_2> *)&maxLevel_1,local_78,local_7c);
          bVar1 = isMipmapLinearSampleResultValid
                            (pCVar5,level1,sampler,FVar4,prec,fVar6,iVar2,(Vec2 *)&maxLevel_1,
                             (Vec4 *)layerRange.m_data);
          if (bVar1) {
            return true;
          }
        }
      }
    }
    minTexLevel = minTexLevel + 1;
  } while( true );
}

Assistant:

bool isLookupResultValid (const Texture1DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.y(), coord.y());
	const float		coordX			= coord.x();
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordX, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordX, layer, result))
					return true;
			}
		}
	}

	return false;
}